

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_filter.cpp
# Opt level: O1

void __thiscall tst_helpers_filter::delayedRejected(tst_helpers_filter *this)

{
  QSharedData *pQVar1;
  long *plVar2;
  PromiseResolver<bool> PVar3;
  _func_int **pp_Var4;
  char16_t *pcVar5;
  QArrayData *pQVar6;
  char cVar7;
  bool bVar8;
  PromiseData<QList<int>_> *pPVar9;
  PromiseData<bool> *pPVar10;
  QObject *pQVar11;
  int *piVar12;
  QEvent *this_00;
  undefined **ppuVar13;
  QPromiseReject<QList<int>_> *reject;
  long lVar14;
  undefined **ppuVar15;
  QByteArrayView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data> local_160;
  PromiseResolver<bool> resolver;
  PromiseResolver<bool> resolver_1;
  QPromise<QList<int>_> local_128;
  qsizetype local_118;
  QPromise<QList<int>_> p;
  QPromise<bool> local_100;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data> local_f0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data> local_e8;
  QString local_e0;
  QArrayData *d;
  undefined8 uStack_c0;
  QArrayData *local_b8;
  _Invoker_type local_b0;
  undefined8 local_a8;
  function<void_(const_QList<bool>_&)> local_98;
  _func_int **local_70;
  QPromise<bool> local_68;
  undefined4 local_54;
  _func_int **local_50;
  _func_int **local_48;
  _Invoker_type local_40;
  long local_38;
  
  reject = (QPromiseReject<QList<int>_> *)0x1;
  local_40 = (_Invoker_type)QArrayData::allocate(&d,4,8,3,KeepSize);
  pQVar6 = d;
  *(undefined8 *)local_40 = 0x2b0000002a;
  *(undefined4 *)(local_40 + 8) = 0x2c;
  d = (QArrayData *)0x0;
  uStack_c0 = (pointer)0x0;
  local_b8 = (QArrayData *)0x0;
  lVar14 = 0;
  ppuVar15 = &PTR__PromiseDataBase_001355c8;
  ppuVar13 = &PTR__PromiseData_00135550;
  local_70 = (_func_int **)&PTR__QPromiseBase_001354e8;
  local_48 = (_func_int **)&PTR__PromiseDataBase_001355c8;
  local_50 = (_func_int **)&PTR__PromiseData_00135550;
  do {
    local_128.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00135530;
    pPVar9 = (PromiseData<QList<int>_> *)operator_new(0x68);
    (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)
     &(pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData = 0;
    (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
    _M_exception_object = (void *)0x0;
    (pPVar9->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
    (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
    (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
         (Data *)0x0;
    (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
         (Data *)0x0;
    (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
    *(undefined8 *)&(pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock =
         0;
    *(undefined8 *)&(pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled
         = 0;
    (pPVar9->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
         (_func_int **)ppuVar15;
    QReadWriteLock::QReadWriteLock
              (&(pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock,0);
    (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled = false;
    (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
         (Data *)0x0;
    (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
    (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
    (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
         (Data *)0x0;
    (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
    (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
    _M_exception_object = (void *)0x0;
    (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
         (_func_int **)ppuVar13;
    (pPVar9->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pPVar9->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    LOCK();
    pQVar1 = &(pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (pPVar9 != (PromiseData<QList<int>_> *)0x0) {
      LOCK();
      pQVar1 = &(pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_98.super__Function_base._M_functor._M_unused._M_object = local_70;
    local_128.super_QPromiseBase<QList<int>_>.m_d.d = pPVar9;
    local_98.super__Function_base._M_functor._8_8_ = pPVar9;
    QtPromisePrivate::PromiseResolver<bool>::PromiseResolver(&resolver,(QPromise<bool> *)&local_98);
    local_98.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00135530;
    if ((long *)local_98.super__Function_base._M_functor._8_8_ != (long *)0x0) {
      LOCK();
      plVar2 = (long *)(local_98.super__Function_base._M_functor._8_8_ + 8);
      *(int *)plVar2 = *(int *)plVar2 + -1;
      UNLOCK();
      if ((*(int *)plVar2 == 0) &&
         ((long *)local_98.super__Function_base._M_functor._8_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_98.super__Function_base._M_functor._8_8_ + 8))();
      }
    }
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
    }
    local_e8 = resolver.m_d.d;
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
    }
    local_f0 = resolver.m_d.d;
    local_54 = *(undefined4 *)(local_40 + lVar14);
    local_100.super_QPromiseBase<bool>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00135530;
    local_38 = lVar14;
    pPVar10 = (PromiseData<bool> *)operator_new(0x68);
    (pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>)._vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)&(pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>).super_QSharedData =
         0;
    (pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_error.m_data._M_exception_object =
         (void *)0x0;
    (pPVar10->m_value).m_data.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_catchers.d.size = 0;
    (pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_handlers.d.size = 0;
    (pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_catchers.d.d = (Data *)0x0;
    (pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_handlers.d.d = (Data *)0x0;
    (pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
    *(undefined8 *)&(pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_lock = 0;
    *(undefined8 *)&(pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_settled = 0;
    (pPVar10->m_value).m_data.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>)._vptr_PromiseDataBase =
         (_func_int **)ppuVar15;
    QReadWriteLock::QReadWriteLock
              (&(pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_lock,0);
    (pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_settled = false;
    (pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_handlers.d.d = (Data *)0x0;
    (pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
    (pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_handlers.d.size = 0;
    (pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_catchers.d.d = (Data *)0x0;
    (pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_catchers.d.size = 0;
    (pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_error.m_data._M_exception_object =
         (void *)0x0;
    (pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>)._vptr_PromiseDataBase =
         (_func_int **)ppuVar13;
    (pPVar10->m_value).m_data.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pPVar10->m_value).m_data.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    LOCK();
    pQVar1 = &(pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (pPVar10 != (PromiseData<bool> *)0x0) {
      LOCK();
      pQVar1 = &(pPVar10->super_PromiseDataBase<bool,_void_(const_bool_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_68.super_QPromiseBase<bool>._vptr_QPromiseBase = local_70;
    local_100.super_QPromiseBase<bool>.m_d.d = pPVar10;
    local_68.super_QPromiseBase<bool>.m_d.d = pPVar10;
    QtPromisePrivate::PromiseResolver<bool>::PromiseResolver(&resolver_1,&local_68);
    local_68.super_QPromiseBase<bool>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00135530
    ;
    if (local_68.super_QPromiseBase<bool>.m_d.d != (PromiseData<bool> *)0x0) {
      LOCK();
      pQVar1 = &((local_68.super_QPromiseBase<bool>.m_d.d)->
                super_PromiseDataBase<bool,_void_(const_bool_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         (local_68.super_QPromiseBase<bool>.m_d.d != (PromiseData<bool> *)0x0)) {
        (*((local_68.super_QPromiseBase<bool>.m_d.d)->
          super_PromiseDataBase<bool,_void_(const_bool_&)>)._vptr_PromiseDataBase[1])();
      }
    }
    PVar3.m_d.d = resolver_1.m_d.d;
    if (resolver_1.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
    }
    pQVar11 = (QObject *)QThread::currentThread();
    if (pQVar11 == (QObject *)0x0) {
      piVar12 = (int *)0x0;
    }
    else {
      piVar12 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar11);
    }
    if (piVar12 != (int *)0x0) {
      if (((pQVar11 != (QObject *)0x0) && (piVar12[1] != 0)) &&
         (cVar7 = QThread::isFinished(), cVar7 == '\0')) {
        if (piVar12[1] == 0) {
          pQVar11 = (QObject *)0x0;
        }
        pQVar11 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pQVar11);
        if ((pQVar11 != (QObject *)0x0) || (cVar7 = QCoreApplication::closingDown(), cVar7 == '\0'))
        {
          this_00 = (QEvent *)operator_new(0x28);
          QEvent::QEvent(this_00,None);
          *(undefined ***)this_00 = &PTR__Event_00135268;
          *(undefined4 *)(this_00 + 0x10) = local_54;
          *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data> *)
           (this_00 + 0x18) = PVar3.m_d.d;
          if (PVar3.m_d.d != (Data *)0x0) {
            LOCK();
            *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + 1;
            UNLOCK();
          }
          *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data> *)
           (this_00 + 0x20) = PVar3.m_d.d;
          if (PVar3.m_d.d != (Data *)0x0) {
            LOCK();
            *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + 1;
            UNLOCK();
          }
          QCoreApplication::postEvent(pQVar11,this_00,0);
        }
      }
      LOCK();
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if (*piVar12 == 0) {
        operator_delete(piVar12);
      }
    }
    if (PVar3.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
      UNLOCK();
      if (*(int *)PVar3.m_d.d == 0) {
        operator_delete((void *)PVar3.m_d.d,0x10);
      }
    }
    if (PVar3.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
      UNLOCK();
      if (*(int *)PVar3.m_d.d == 0) {
        operator_delete((void *)PVar3.m_d.d,0x10);
      }
      LOCK();
      *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
      UNLOCK();
      if (*(int *)PVar3.m_d.d == 0) {
        operator_delete((void *)PVar3.m_d.d,0x10);
      }
    }
    if (PVar3.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
      UNLOCK();
      if (*(int *)PVar3.m_d.d == 0) {
        operator_delete((void *)PVar3.m_d.d,0x10);
      }
    }
    lVar14 = local_38;
    ppuVar15 = local_48;
    ppuVar13 = local_50;
    if (resolver_1.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
      UNLOCK();
      if ((*(int *)resolver_1.m_d.d == 0) && (resolver_1.m_d.d != (Data *)0x0)) {
        operator_delete((void *)resolver_1.m_d.d,0x10);
      }
    }
    local_100.super_QPromiseBase<bool>._vptr_QPromiseBase = local_70;
    QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<bool>>::
    call<QtPromise::QPromiseResolve<bool>,QtPromise::QPromiseReject<bool>>
              (&local_100,(QPromiseResolve<bool> *)&local_e8,(QPromiseReject<bool> *)&local_f0);
    local_100.super_QPromiseBase<bool>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00135530;
    if (local_100.super_QPromiseBase<bool>.m_d.d != (PromiseData<bool> *)0x0) {
      LOCK();
      pQVar1 = &((local_100.super_QPromiseBase<bool>.m_d.d)->
                super_PromiseDataBase<bool,_void_(const_bool_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         (local_100.super_QPromiseBase<bool>.m_d.d != (PromiseData<bool> *)0x0)) {
        (*((local_100.super_QPromiseBase<bool>.m_d.d)->
          super_PromiseDataBase<bool,_void_(const_bool_&)>)._vptr_PromiseDataBase[1])();
      }
    }
    if (local_f0.d != (Data *)0x0) {
      LOCK();
      ((local_f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
      ._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            ((local_f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if (((__int_type)
           ((local_f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
         (local_f0.d != (Data *)0x0)) {
        operator_delete(local_f0.d,0x10);
      }
    }
    if (local_e8.d != (Data *)0x0) {
      LOCK();
      ((local_e8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
      ._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((local_e8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
         (local_e8.d != (Data *)0x0)) {
        operator_delete(local_e8.d,0x10);
      }
    }
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
      UNLOCK();
      if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
        operator_delete((void *)resolver.m_d.d,0x10);
      }
    }
    local_128.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = local_70;
    std::vector<QtPromise::QPromise<bool>,std::allocator<QtPromise::QPromise<bool>>>::
    emplace_back<QtPromise::QPromise<bool>>
              ((vector<QtPromise::QPromise<bool>,std::allocator<QtPromise::QPromise<bool>>> *)&d,
               (QPromise<bool> *)&local_128);
    local_128.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00135530;
    if (local_128.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
      LOCK();
      pQVar1 = &((local_128.super_QPromiseBase<QList<int>_>.m_d.d)->
                super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         (local_128.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0)) {
        (*((local_128.super_QPromiseBase<QList<int>_>.m_d.d)->
          super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase[1])();
      }
    }
    lVar14 = lVar14 + 4;
  } while (lVar14 != 0xc);
  QtPromise::all<bool,_std::vector,_std::allocator<QtPromise::QPromise<bool>_>_>
            ((QtPromise *)&local_e0,
             (vector<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_> *)&d);
  std::vector<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_>::~vector
            ((vector<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_> *)&d);
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001354b8;
  pPVar9 = (PromiseData<QList<int>_> *)operator_new(0x68);
  (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &(pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData = 0;
  (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar9->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  *(undefined8 *)&(pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled =
       0;
  (pPVar9->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00135980;
  QReadWriteLock::QReadWriteLock
            (&(pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock,0);
  (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled = false;
  (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_00135918;
  (pPVar9->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar9->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar1 = &(pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData
  ;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar9 != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar9->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_128.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_001358e0;
  local_128.super_QPromiseBase<QList<int>_>.m_d.d = pPVar9;
  p.super_QPromiseBase<QList<int>_>.m_d.d = pPVar9;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
            ((PromiseResolver<QList<int>_> *)&resolver_1,&local_128);
  local_128.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_001354b8;
  if (local_128.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((local_128.super_QPromiseBase<QList<int>_>.m_d.d)->
              super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_128.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0)) {
      (*((local_128.super_QPromiseBase<QList<int>_>.m_d.d)->
        super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  pcVar5 = local_e0.d.ptr;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_160 = resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  resolver = resolver_1;
  d = (QArrayData *)resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  uStack_c0 = resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_b8 = pQVar6;
  local_b0 = local_40;
  local_a8 = 3;
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98.super__Function_base._M_manager = (_Manager_type)0x0;
  local_98._M_invoker = (_Invoker_type)0x0;
  local_98.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_98.super__Function_base._M_functor._8_8_ = 0;
  local_98.super__Function_base._M_functor._M_unused._M_object = operator_new(0x28);
  *(QArrayData **)local_98.super__Function_base._M_functor._M_unused._0_8_ = d;
  if (d != (QArrayData *)0x0) {
    LOCK();
    (d->ref_)._q_value.super___atomic_base<int>._M_i =
         (d->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_98.super__Function_base._M_functor._M_unused._0_8_ + 8) = uStack_c0;
  if ((Data *)uStack_c0 != (Data *)0x0) {
    LOCK();
    *(int *)uStack_c0 = *(int *)uStack_c0 + 1;
    UNLOCK();
  }
  *(QArrayData **)((long)local_98.super__Function_base._M_functor._M_unused._0_8_ + 0x10) = local_b8
  ;
  *(_Invoker_type *)((long)local_98.super__Function_base._M_functor._M_unused._0_8_ + 0x18) =
       local_b0;
  *(undefined8 *)((long)local_98.super__Function_base._M_functor._M_unused._0_8_ + 0x20) = local_a8;
  if (local_b8 != (QArrayData *)0x0) {
    LOCK();
    (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98._M_invoker =
       std::
       _Function_handler<void_(const_QList<bool>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
       ::_M_invoke;
  local_98.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_QList<bool>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
       ::_M_manager;
  if (local_b8 != (QArrayData *)0x0) {
    LOCK();
    (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_b8,4,8);
    }
  }
  if ((Data *)uStack_c0 != (Data *)0x0) {
    LOCK();
    *(int *)uStack_c0 = *(int *)uStack_c0 + -1;
    UNLOCK();
    if ((*(int *)uStack_c0 == 0) && ((Data *)uStack_c0 != (Data *)0x0)) {
      operator_delete((void *)uStack_c0,0x10);
    }
  }
  if (d != (QArrayData *)0x0) {
    LOCK();
    (d->ref_)._q_value.super___atomic_base<int>._M_i =
         (d->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((d->ref_)._q_value.super___atomic_base<int>._M_i == 0) && (d != (QArrayData *)0x0)) {
      operator_delete(d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)>::addHandler
            ((PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)pcVar5,&local_98);
  if (local_98.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_98.super__Function_base._M_manager)
              ((_Any_data *)&local_98,(_Any_data *)&local_98,__destroy_functor);
  }
  pcVar5 = local_e0.d.ptr;
  QtPromisePrivate::PromiseCatcher<QList<bool>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&d,
             (PromiseCatcher<QList<bool>,decltype(nullptr),void> *)0x0,&local_160,
             (QPromiseResolve<QList<int>_> *)&resolver,reject);
  QtPromisePrivate::PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)>::addCatcher
            ((PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)pcVar5,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&d);
  if (local_b8 != (QArrayData *)0x0) {
    (*(code *)local_b8)(&d,&d,3);
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  if (local_160.d != (Data *)0x0) {
    LOCK();
    ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_160.d != (Data *)0x0)) {
      operator_delete(local_160.d,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_1.m_d.d == 0) && (resolver_1.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  pcVar5 = local_e0.d.ptr;
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001358e0;
  bVar8 = QtPromisePrivate::PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)>::isPending
                    ((PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)local_e0.d.ptr);
  if (!bVar8) {
    QtPromisePrivate::PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)>::dispatch
              ((PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)pcVar5);
  }
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar6,4,8);
    }
  }
  local_e0.d.d = (Data *)&PTR__QPromiseBase_001356e8;
  if ((PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)local_e0.d.ptr !=
      (PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)((long)local_e0.d.ptr + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)local_e0.d.ptr !=
        (PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)0x0)) {
      (*(*(_func_int ***)local_e0.d.ptr)[1])();
    }
  }
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar6,4,8);
    }
  }
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data>)(Data *)0x0;
  waitForError<QList<int>,QString>(&local_e0,&p,(QString *)&resolver_1);
  QVar16.m_data = (storage_type *)0x3;
  QVar16.m_size = (qsizetype)&local_128;
  QString::fromUtf8(QVar16);
  pp_Var4 = local_128.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase;
  QVar17.m_data = local_e0.d.ptr;
  QVar17.m_size = local_e0.d.size;
  QVar18.m_data = (storage_type_conflict *)local_128.super_QPromiseBase<QList<int>_>.m_d.d;
  QVar18.m_size = local_118;
  QTest::qCompare(QVar17,QVar18,"waitForError(p, QString{})","QString{\"foo\"}",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_filter.cpp"
                  ,100);
  if ((QArrayData *)pp_Var4 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)pp_Var4)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)pp_Var4)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)pp_Var4)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)pp_Var4,2,8);
    }
  }
  if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,8);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      QArrayData::deallocate((QArrayData *)resolver_1.m_d.d,2,8);
    }
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001354b8;
  if (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((p.super_QPromiseBase<QList<int>_>.m_d.d)->
              super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0)) {
      (*((p.super_QPromiseBase<QList<int>_>.m_d.d)->
        super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_helpers_filter::sequenceTypes()
{
    SequenceTester<QList<int>>::exec();
    SequenceTester<QVector<int>>::exec();
    SequenceTester<std::list<int>>::exec();
    SequenceTester<std::vector<int>>::exec();
}